

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleContextMenuEvent(QWidgetWindow *this,QContextMenuEvent *e)

{
  long lVar1;
  Data *pDVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QPoint globalPos;
  QPoint pos;
  QContextMenuEvent widgetEvent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((qt_last_mouse_receiver.wp.d == (Data *)0x0) ||
     (pQVar3 = (QWidget *)qt_last_mouse_receiver.wp.value,
     *(int *)(qt_last_mouse_receiver.wp.d + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  pos = *(QPoint *)(e + 0x28);
  globalPos = *(QPoint *)(e + 0x30);
  if (e[0x38] == (QContextMenuEvent)0x1) {
    pQVar3 = QWidget::keyboardGrabber();
    if (pQVar3 == (QWidget *)0x0) {
      pQVar3 = QApplication::activePopupWidget();
      if (pQVar3 == (QWidget *)0x0) {
        pQVar3 = QApplication::focusWidget();
        if (pQVar3 == (QWidget *)0x0) {
          pDVar2 = (this->m_widget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar3 = (QWidget *)0x0;
          }
          else {
            pQVar3 = (QWidget *)(this->m_widget).wp.value;
          }
        }
        else {
          pQVar3 = QApplication::focusWidget();
        }
      }
      else {
        pQVar3 = QApplication::activePopupWidget();
        pQVar4 = QWidget::focusWidget(pQVar3);
        pQVar3 = QApplication::activePopupWidget();
        if (pQVar4 != (QWidget *)0x0) {
          pQVar3 = QWidget::focusWidget(pQVar3);
        }
      }
    }
    if (pQVar3 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar3 + 400))(&widgetEvent,pQVar3,2);
      auVar5 = ::QVariant::toRect();
      pos = (QPoint)(((long)auVar5._8_4_ + (long)auVar5._0_4_) / 2 & 0xffffffffU |
                    ((auVar5._8_8_ >> 0x20) + (auVar5._0_8_ >> 0x20)) / 2 << 0x20);
      ::QVariant::~QVariant((QVariant *)&widgetEvent);
      globalPos = QWidget::mapToGlobal(pQVar3,&pos);
      goto LAB_002b1256;
    }
  }
  else if (pQVar3 != (QWidget *)0x0) {
    pos = QWidget::mapFromGlobal(pQVar3,(QPoint *)(e + 0x30));
    goto LAB_002b1256;
  }
  pQVar3 = (QWidget *)0x0;
LAB_002b1256:
  if ((pQVar3 != (QWidget *)0x0) && ((pQVar3->data->widget_attributes & 1) == 0)) {
    _widgetEvent = 0xaaaaaaaa;
    QContextMenuEvent::QContextMenuEvent
              (&widgetEvent,e[0x38],&pos,&globalPos,*(undefined4 *)(e + 0x20));
    QCoreApplication::forwardEvent(&pQVar3->super_QObject,(QEvent *)&widgetEvent,(QEvent *)e);
    QContextMenuEvent::~QContextMenuEvent(&widgetEvent);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleContextMenuEvent(QContextMenuEvent *e)
{
    QWidget *receiver = qt_last_mouse_receiver.get();
    QPoint pos = e->pos();
    QPoint globalPos = e->globalPos();

    // Keyboard-originating context menu events are delivered to the focus widget,
    // independently of event position.
    if (e->reason() == QContextMenuEvent::Keyboard) {
        receiver = QWidget::keyboardGrabber();
        if (!receiver) {
            if (QApplication::activePopupWidget()) {
                receiver = (QApplication::activePopupWidget()->focusWidget()
                            ? QApplication::activePopupWidget()->focusWidget()
                            : QApplication::activePopupWidget());
            } else if (QApplication::focusWidget()) {
                receiver = QApplication::focusWidget();
            } else {
                receiver = m_widget;
            }
        }
        if (Q_LIKELY(receiver)) {
            pos = receiver->inputMethodQuery(Qt::ImCursorRectangle).toRect().center();
            globalPos = receiver->mapToGlobal(pos);
        }
    } else if (Q_LIKELY(receiver)) {
        pos = receiver->mapFromGlobal(e->globalPos());
    }

    if (receiver && receiver->isEnabled()) {
        QContextMenuEvent widgetEvent(e->reason(), pos, globalPos, e->modifiers());
        QGuiApplication::forwardEvent(receiver, &widgetEvent, e);
    }
}